

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O2

realtype SUNRpowerI(realtype base,int exponent)

{
  int iVar1;
  bool bVar2;
  realtype rVar3;
  
  iVar1 = -exponent;
  if (0 < exponent) {
    iVar1 = exponent;
  }
  rVar3 = 1.0;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    rVar3 = rVar3 * base;
  }
  if (exponent < 0) {
    rVar3 = 1.0 / rVar3;
  }
  return rVar3;
}

Assistant:

realtype SUNRpowerI(realtype base, int exponent)
{
  int i, expt;
  realtype prod;

  prod = ONE;
  expt = abs(exponent);
  for(i = 1; i <= expt; i++) prod *= base;
  if (exponent < 0) prod = ONE/prod;
  return(prod);
}